

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
serial::Serial::readlines
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Serial *this,size_t size,string *eol)

{
  SerialImpl *pSVar1;
  pointer __s2;
  long lVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar3;
  _Alloc_hider _Var4;
  size_type __n;
  size_t sVar5;
  int iVar6;
  ssize_t sVar7;
  string *__nbytes;
  ulong uVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  ulong uVar11;
  undefined1 *puVar12;
  bool bVar13;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  Serial *local_90;
  long local_88;
  string *local_80;
  undefined1 *local_78;
  size_t local_70;
  SerialImpl *local_68;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = this->pimpl_;
  uStack_a0 = 0x1078d8;
  __nbytes = eol;
  local_90 = this;
  SerialImpl::readLock(local_68);
  uVar11 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = -eol->_M_string_length;
  lVar2 = -(size + 0xf & 0xfffffffffffffff0);
  puVar12 = auStack_98 + lVar2;
  local_58 = 0;
  local_80 = eol;
  local_78 = puVar12;
  local_70 = size;
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  do {
    if (size <= uVar11) goto LAB_00107aa4;
    pSVar1 = local_90->pimpl_;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107941;
    sVar7 = SerialImpl::read(pSVar1,(int)uVar11 + (int)puVar12,(void *)0x1,(size_t)__nbytes);
    uVar11 = uVar11 + sVar7;
    if (sVar7 == 0) {
      if (local_58 == uVar11) goto LAB_00107aa4;
      puVar10 = puVar12 + local_58;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107a7e;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar10,puVar12 + uVar11);
      pvVar3 = local_60;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107a8b;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar3,&local_50);
      goto LAB_00107a8b;
    }
    puVar10 = puVar12 + uVar11;
    puVar12 = puVar10 + local_88;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x10796c;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar12,puVar10);
    __n = local_50._M_string_length;
    _Var4._M_p = local_50._M_dataplus._M_p;
    if (local_50._M_string_length == local_80->_M_string_length) {
      if (local_50._M_string_length == 0) {
        bVar13 = true;
      }
      else {
        __s2 = (local_80->_M_dataplus)._M_p;
        *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107992;
        iVar6 = bcmp(_Var4._M_p,__s2,__n);
        bVar13 = iVar6 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != &local_50.field_2) {
      uVar8 = local_50.field_2._M_allocated_capacity + 1;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x1079be;
      operator_delete(_Var4._M_p,uVar8);
    }
    puVar12 = local_78;
    size = local_70;
    sVar5 = local_58;
    if (bVar13) {
      puVar9 = local_78 + local_58;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x1079e5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar9,puVar10);
      pvVar3 = local_60;
      size = local_70;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x1079f5;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar3,&local_50);
      _Var4._M_p = local_50._M_dataplus._M_p;
      sVar5 = uVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar8 = local_50.field_2._M_allocated_capacity + 1;
        *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107a0e;
        operator_delete(_Var4._M_p,uVar8);
      }
    }
    local_58 = sVar5;
  } while (uVar11 != size);
  if (local_58 != size) {
    puVar10 = puVar12 + local_58;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107a4c;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar10,puVar12 + size);
    pvVar3 = local_60;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107a59;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(pvVar3,&local_50);
LAB_00107a8b:
    _Var4._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107aa4;
      operator_delete(_Var4._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00107aa4:
  pSVar1 = local_68;
  *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x107aad;
  SerialImpl::readUnlock(pSVar1);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_60;
}

Assistant:

vector<string>
Serial::readlines (size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  std::vector<std::string> lines;
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
    (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  size_t start_of_line = 0;
  while (read_so_far < size) {
    size_t bytes_read = this->read_ (buffer_+read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      if (start_of_line != read_so_far) {
        lines.push_back (
          string (reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      // EOL found
      lines.push_back(
        string(reinterpret_cast<const char*> (buffer_ + start_of_line),
          read_so_far - start_of_line));
      start_of_line = read_so_far;
    }
    if (read_so_far == size) {
      if (start_of_line != read_so_far) {
        lines.push_back(
          string(reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Reached the maximum read length
    }
  }
  return lines;
}